

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread_unix.cpp
# Opt level: O2

__pid_t __thiscall QThreadPrivate::wait(QThreadPrivate *this,void *__stat_loc)

{
  int iVar1;
  uint uVar2;
  QDeadlineTimer deadline;
  __pid_t _Var3;
  undefined4 uVar4;
  long in_RDX;
  long in_FS_OFFSET;
  bool bVar5;
  timespec tVar6;
  undefined8 in_stack_ffffffffffffff58;
  timespec *local_a0;
  __pthread_cleanup_class local_90;
  timespec local_78;
  __pthread_cleanup_class local_68;
  QThreadPrivate *local_50;
  void *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.tv_sec = (__time_t)&DAT_aaaaaaaaaaaaaaaa;
  local_78.tv_nsec = (__syscall_slong_t)&DAT_aaaaaaaaaaaaaaaa;
  tVar6.tv_nsec = (__syscall_slong_t)&DAT_aaaaaaaaaaaaaaaa;
  tVar6.tv_sec = (__time_t)&DAT_aaaaaaaaaaaaaaaa;
  if (in_RDX == 0x7fffffffffffffff) {
    local_a0 = (timespec *)0x0;
  }
  else {
    deadline._8_8_ = in_stack_ffffffffffffff58;
    deadline.t1 = 0x37c49f;
    tVar6 = deadlineToAbstime<1>(deadline);
    local_a0 = &local_78;
  }
  iVar1 = this->waiters;
  uVar2 = iVar1 + 1;
  this->waiters = uVar2;
  bVar5 = -2 < iVar1;
  local_90.__cancel_routine = wait::anon_class_1_0_00000001::__invoke;
  local_90.__do_it = 1;
  local_90.__cancel_type = -0x55555556;
  local_90.__cancel_arg = &this->waiters;
  local_78 = tVar6;
  while ((!bVar5 || (this->data->isAdopted != false))) {
    _Var3 = QWaitCondition::wait(&this->thread_done,*__stat_loc);
    if ((this->threadState != Finished & (byte)_Var3) != 1) goto LAB_0037c5c9;
    uVar2 = this->waiters;
    bVar5 = -1 < (int)uVar2;
  }
  local_40 = 0xaaaaaaaa0000006e;
  this->waiters = uVar2 | 0x80000000;
  local_50 = this;
  local_48 = __stat_loc;
  QMutexLocker<QMutex>::unlock((QMutexLocker<QMutex> *)__stat_loc);
  local_68.__do_it = 1;
  local_68.__cancel_type = -0x55555556;
  local_68.__cancel_routine = anon_func::CancelState::run;
  local_68.__cancel_arg = &local_50;
  uVar4 = pthread_clockjoin_np
                    ((this->data->threadId).super_QBasicAtomicPointer<void>._q_value._M_b._M_p,0,1,
                     local_a0);
  local_40 = CONCAT44(local_40._4_4_,uVar4);
  local_68.__do_it = 1;
  __pthread_cleanup_class::~__pthread_cleanup_class(&local_68);
  _Var3 = (__pid_t)CONCAT71((int7)((ulong)&local_50 >> 8),(int)local_40 != 0x6e);
LAB_0037c5c9:
  local_90.__do_it = 1;
  __pthread_cleanup_class::~__pthread_cleanup_class(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return _Var3;
  }
  __stack_chk_fail();
}

Assistant:

bool QThreadPrivate::wait(QMutexLocker<QMutex> &locker, QDeadlineTimer deadline)
{
    constexpr int HasJoinerBit = int(0x8000'0000);  // a.k.a. sign bit
    struct timespec ts, *pts = nullptr;
    if (!deadline.isForever()) {
        ts = deadlineToAbstime(deadline);
        pts = &ts;
    }

    auto doJoin = [&] {
        // pthread_join() & family are cancellation points
        struct CancelState {
            QThreadPrivate *d;
            QMutexLocker<QMutex> *locker;
            int joinResult = ETIMEDOUT;
            static void run(void *arg) { static_cast<CancelState *>(arg)->run(); }
            void run()
            {
                locker->relock();
                if (joinResult == ETIMEDOUT && d->waiters)
                    d->thread_done.wakeOne();
                else if (joinResult == 0)
                    wakeAllInternal(d);
                d->waiters &= ~HasJoinerBit;
            }
        } nocancel = { this, &locker };
        int &r = nocancel.joinResult;

        // we're going to perform the join, so don't let other threads do it
        waiters |= HasJoinerBit;
        locker.unlock();

        pthread_cleanup_push(&CancelState::run, &nocancel);
        pthread_t thrId = from_HANDLE<pthread_t>(data->threadId.loadRelaxed());
        if constexpr (QT_CONFIG(pthread_clockjoin))
            r = pthread_clockjoin_np(thrId, nullptr, SteadyClockClockId, pts);
        else
            r = pthread_timedjoin_np(thrId, nullptr, pts);
        Q_ASSERT(r == 0 || r == ETIMEDOUT);
        pthread_cleanup_pop(1);

        Q_ASSERT(waiters >= 0);
        return r != ETIMEDOUT;
    };
    Q_ASSERT(threadState != QThreadPrivate::Finished);
    Q_ASSERT(locker.isLocked());

    bool result = false;

    // both branches call cancellation points
    ++waiters;
    bool mustJoin = (waiters & HasJoinerBit) == 0;
    pthread_cleanup_push([](void *ptr) {
        --(*static_cast<decltype(waiters) *>(ptr));
    }, &waiters);
    for (;;) {
        if (UsingPThreadTimedJoin && mustJoin && !data->isAdopted) {
            result = doJoin();
            break;
        }
        if (!thread_done.wait(locker.mutex(), deadline))
            break;      // timed out
        result = threadState == QThreadPrivate::Finished;
        if (result)
            break;      // success
        mustJoin = (waiters & HasJoinerBit) == 0;
    }
    pthread_cleanup_pop(1);

    return result;
}